

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_flip_inplace_closed
               (roaring_bitmap_t *x1,uint32_t range_start,uint32_t range_end)

{
  uint16_t lb_start_00;
  short sVar1;
  uint16_t hb_00;
  uint16_t lb_end_00;
  uint in_EDX;
  uint in_ESI;
  uint32_t hb;
  uint16_t lb_end;
  uint16_t hb_end;
  uint16_t lb_start;
  uint16_t hb_start;
  undefined4 local_1c;
  
  if (in_ESI <= in_EDX) {
    hb_00 = (uint16_t)(in_ESI >> 0x10);
    lb_start_00 = (uint16_t)in_ESI;
    lb_end_00 = (uint16_t)(in_EDX >> 0x10);
    sVar1 = (short)in_EDX;
    if (hb_00 == lb_end_00) {
      inplace_flip_container((roaring_array_t *)CONCAT44(in_ESI,in_EDX),hb_00,lb_start_00,lb_end_00)
      ;
    }
    else {
      if (lb_start_00 != 0) {
        inplace_flip_container
                  ((roaring_array_t *)CONCAT44(in_ESI,in_EDX),hb_00,lb_start_00,lb_end_00);
        hb_00 = hb_00 + 1;
      }
      if (sVar1 != -1) {
        lb_end_00 = lb_end_00 - 1;
      }
      for (local_1c = (uint)hb_00; local_1c <= lb_end_00; local_1c = local_1c + 1) {
        inplace_fully_flip_container((roaring_array_t *)CONCAT44(in_ESI,in_EDX),hb_00);
      }
      if (sVar1 != -1) {
        inplace_flip_container
                  ((roaring_array_t *)CONCAT44(in_ESI,in_EDX),hb_00,lb_start_00,lb_end_00);
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_flip_inplace_closed(roaring_bitmap_t *x1,
                                        uint32_t range_start,
                                        uint32_t range_end) {
    if (range_start > range_end) {
        return;  // empty range
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)(range_end >> 16);
    const uint16_t lb_end = (uint16_t)range_end;

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, (uint16_t)hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}